

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnicodeText.Common.cpp
# Opt level: O0

int PlatformAgnostic::UnicodeText::Internal::readNumber<char16_t_const>(char16_t **str)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  int local_1c;
  int newNum;
  int num;
  char16_t **str_local;
  
  local_1c = 0;
  while( true ) {
    bVar2 = isDigit<char16_t>(**str);
    if (!bVar2) {
      return local_1c;
    }
    iVar3 = local_1c * 10 + ((ushort)**str - 0x30);
    if (iVar3 <= local_1c) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/PlatformAgnostic/Platform/Common/UnicodeText.Common.cpp"
                         ,0x3d,"(newNum > num)","newNum > num");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    if (iVar3 <= local_1c) break;
    *str = *str + 1;
    local_1c = iVar3;
  }
  return local_1c;
}

Assistant:

int readNumber(__inout CharType* &str)
            {
                int num = 0;

                // Count digits on each string
                while (isDigit(*str))
                {
                    int newNum = (num * 10) + (*str - '0');
                    Assert(newNum > num);
                    if (newNum <= num)
                    {
                        return num;
                    }

                    num = newNum;

                    str++;
                }

                return num;
            }